

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

bool EndsWith(string *fullString,string *ending,bool caseInsensitive)

{
  pointer pcVar1;
  long *plVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  string comparison;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if (fullString->_M_string_length < ending->_M_string_length) {
    bVar6 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)fullString);
    pcVar1 = (ending->_M_dataplus)._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + ending->_M_string_length);
    sVar3 = local_58;
    plVar2 = local_60;
    if (caseInsensitive) {
      if (local_58 != 0) {
        sVar5 = 0;
        do {
          iVar4 = tolower((uint)*(byte *)((long)plVar2 + sVar5));
          *(char *)((long)plVar2 + sVar5) = (char)iVar4;
          sVar5 = sVar5 + 1;
        } while (sVar3 != sVar5);
      }
      sVar3 = local_38;
      plVar2 = local_40;
      if (local_38 != 0) {
        sVar5 = 0;
        do {
          iVar4 = tolower((uint)*(byte *)((long)plVar2 + sVar5));
          *(char *)((long)plVar2 + sVar5) = (char)iVar4;
          sVar5 = sVar5 + 1;
        } while (sVar3 != sVar5);
      }
    }
    if (local_58 == local_38) {
      if (local_58 == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_60,local_40,local_58);
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
  }
  return bVar6;
}

Assistant:

bool EndsWith(const std::string& fullString, const std::string& ending, bool caseInsensitive)
{
    if (fullString.length() >= ending.length())
    {
        auto substr = fullString.substr(fullString.length() - ending.length(), ending.length());
        auto comparison = ending;

        if (caseInsensitive)
        {
            ToLowerInplace(substr);
            ToLowerInplace(comparison);
        }

        return substr == comparison;
    } else {
        return false;
    }
}